

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

void __thiscall jrtplib::RTCPScheduler::ScheduleBYEPacket(RTCPScheduler *this,size_t packetsize)

{
  bool bVar1;
  int iVar2;
  RTPTime local_28;
  double local_20;
  size_t local_18;
  size_t packetsize_local;
  RTCPScheduler *this_local;
  
  if ((this->byescheduled & 1U) == 0) {
    local_18 = packetsize;
    packetsize_local = (size_t)this;
    if ((this->firstcall & 1U) != 0) {
      this->firstcall = false;
      iVar2 = RTPSources::GetActiveMemberCount(this->sources);
      this->pmembers = iVar2;
    }
    this->byescheduled = true;
    this->avgbyepacketsize = local_18 + this->headeroverhead;
    this->byemembers = 1;
    this->pbyemembers = 1;
    bVar1 = RTCPSchedulerParams::GetRequestImmediateBYE(&this->schedparams);
    if ((bVar1) && (iVar2 = RTPSources::GetActiveMemberCount(this->sources), iVar2 < 0x32)) {
      this->sendbyenow = true;
    }
    else {
      this->sendbyenow = false;
    }
    local_20 = (double)RTPTime::CurrentTime();
    (this->prevrtcptime).m_t = local_20;
    (this->nextrtcptime).m_t = (this->prevrtcptime).m_t;
    local_28 = CalculateBYETransmissionInterval(this);
    RTPTime::operator+=(&this->nextrtcptime,&local_28);
  }
  return;
}

Assistant:

void RTCPScheduler::ScheduleBYEPacket(size_t packetsize)
{
	if (byescheduled)
		return;
	
	if (firstcall)
	{
		firstcall = false;
		pmembers = sources.GetActiveMemberCount();
	}

	byescheduled = true;
	avgbyepacketsize = packetsize+headeroverhead;

	// For now, we will always use the BYE backoff algorithm as described in rfc 3550 p 33
	
	byemembers = 1;
	pbyemembers = 1;

	if (schedparams.GetRequestImmediateBYE() && sources.GetActiveMemberCount() < 50) // p 34 (top)
		sendbyenow = true;
	else
		sendbyenow = false;
	
	prevrtcptime = RTPTime::CurrentTime();
	nextrtcptime = prevrtcptime;
	nextrtcptime += CalculateBYETransmissionInterval();
}